

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O1

ActionResultHolder<BasicTestExpr<2>_> *
testing::internal::ActionResultHolder<BasicTestExpr<2>>::
PerformDefaultAction<BasicTestExpr<2>(bool)>
          (FunctionMockerBase<BasicTestExpr<2>_(bool)> *func_mocker,ArgumentTuple *args,
          string *call_description)

{
  undefined4 uVar1;
  ActionResultHolder<BasicTestExpr<2>_> *pAVar2;
  
  pAVar2 = (ActionResultHolder<BasicTestExpr<2>_> *)operator_new(0x10);
  uVar1 = FunctionMockerBase<BasicTestExpr<2>_(bool)>::PerformDefaultAction
                    (func_mocker,args,call_description);
  (pAVar2->super_UntypedActionResultHolderBase)._vptr_UntypedActionResultHolderBase =
       (_func_int **)&PTR__UntypedActionResultHolderBase_00290728;
  *(undefined4 *)&pAVar2->value_ = uVar1;
  return pAVar2;
}

Assistant:

static ActionResultHolder* PerformDefaultAction(
      const FunctionMockerBase<F>* func_mocker,
      const typename Function<F>::ArgumentTuple& args,
      const string& call_description) {
    return new ActionResultHolder(
        func_mocker->PerformDefaultAction(args, call_description));
  }